

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

bool __thiscall QFileSystemModel::hasChildren(QFileSystemModel *this,QModelIndex *parent)

{
  bool bVar1;
  int iVar2;
  QFileSystemModelPrivate *this_00;
  QFileSystemNode *this_01;
  QFileSystemModelPrivate *in_RSI;
  QFileSystemNode *indexNode;
  QFileSystemModelPrivate *d;
  undefined1 local_1;
  
  this_00 = d_func((QFileSystemModel *)0xaa4d3c);
  iVar2 = QModelIndex::column((QModelIndex *)in_RSI);
  if (iVar2 < 1) {
    bVar1 = QModelIndex::isValid((QModelIndex *)this_00);
    if (bVar1) {
      this_01 = QFileSystemModelPrivate::node(in_RSI,(QModelIndex *)this_00);
      local_1 = QFileSystemModelPrivate::QFileSystemNode::isDir(this_01);
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool QFileSystemModel::hasChildren(const QModelIndex &parent) const
{
    Q_D(const QFileSystemModel);
    if (parent.column() > 0)
        return false;

    if (!parent.isValid()) // drives
        return true;

    const QFileSystemModelPrivate::QFileSystemNode *indexNode = d->node(parent);
    Q_ASSERT(indexNode);
    return (indexNode->isDir());
}